

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

Type __thiscall
wasm::anon_unknown_20::HeapTypeGeneratorImpl::generateSingleType(HeapTypeGeneratorImpl *this)

{
  Random *this_00;
  bool bVar1;
  uint32_t uVar2;
  BasicType BVar3;
  Nullability NVar4;
  FeatureOptions<wasm::Type::BasicType> *pFVar5;
  HeapType HVar6;
  Type TVar7;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
  local_48;
  
  uVar2 = Random::upTo(this->rand,2);
  if (uVar2 == 1) {
    bVar1 = Random::oneIn(this->rand,4);
    if (bVar1) {
      NVar4 = generateBasicHeapType(this);
    }
    else {
      uVar2 = Random::upTo(this->rand,
                           (this->recGroupEnds).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[this->index]);
      local_48._M_impl._0_8_ = this->builder;
      local_48._M_impl.super__Rb_tree_header._M_header._0_8_ = ZEXT48(uVar2);
      HVar6 = TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&local_48);
      NVar4 = (Nullability)HVar6.id;
    }
    Random::oneIn(this->rand,2);
    TVar7.id = wasm::TypeBuilder::getTempRefType((HeapType)this->builder,NVar4);
  }
  else {
    if (uVar2 != 0) {
      wasm::handle_unreachable
                ("unexpected",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                 ,0xc5);
    }
    this_00 = this->rand;
    local_48._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_48._M_impl.super__Rb_tree_header._M_header;
    local_48._M_impl._0_8_ = (TypeBuilder *)0x0;
    local_48._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
    local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_48._M_impl.super__Rb_tree_header._M_header._M_right =
         local_48._M_impl.super__Rb_tree_header._M_header._M_left;
    pFVar5 = Random::FeatureOptions<wasm::Type::BasicType>::
             add<wasm::Type::BasicType,wasm::Type::BasicType,wasm::Type::BasicType>
                       ((FeatureOptions<wasm::Type::BasicType> *)&local_48,(FeatureSet)0x0,i32,i64,
                        f32,f64);
    pFVar5 = Random::FeatureOptions<wasm::Type::BasicType>::add<>(pFVar5,(FeatureSet)0x8,v128);
    BVar3 = Random::pick<wasm::Type::BasicType>(this_00,pFVar5);
    std::
    _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
    ::~_Rb_tree(&local_48);
    TVar7.id = (uintptr_t)BVar3;
  }
  return (Type)TVar7.id;
}

Assistant:

Type generateSingleType() {
    switch (rand.upTo(2)) {
      case 0:
        return generateBasicType();
      case 1:
        return generateRefType();
    }
    WASM_UNREACHABLE("unexpected");
  }